

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::QuadMiMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float fVar1;
  undefined4 uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  Scene *pSVar14;
  Ref<embree::Geometry> *pRVar15;
  Geometry *pGVar16;
  long lVar17;
  long lVar18;
  RTCFilterFunctionN p_Var19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  byte bVar26;
  AABBNodeMB4D *node1;
  ulong uVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  ulong uVar31;
  int iVar32;
  ulong uVar33;
  ulong uVar34;
  uint uVar35;
  long lVar36;
  ulong *puVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  bool bVar41;
  bool bVar42;
  ulong uVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [64];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [16];
  undefined1 auVar101 [64];
  undefined1 auVar102 [16];
  undefined1 auVar103 [64];
  undefined1 in_ZMM17 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  undefined1 local_b40 [16];
  long local_b28;
  long local_b20;
  ulong local_b18;
  undefined1 local_b10 [16];
  undefined1 local_b00 [16];
  RTCFilterFunctionNArguments local_af0;
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [16];
  RTCHitN local_a90 [16];
  undefined1 local_a80 [16];
  undefined1 local_a70 [16];
  undefined1 local_a60 [16];
  undefined1 local_a50 [16];
  undefined1 local_a40 [16];
  undefined1 local_a30 [16];
  uint local_a20;
  uint uStack_a1c;
  uint uStack_a18;
  uint uStack_a14;
  uint uStack_a10;
  uint uStack_a0c;
  uint uStack_a08;
  uint uStack_a04;
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  char local_900;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  float local_880 [4];
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  undefined4 uStack_864;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820;
  size_t local_800;
  ulong local_7f8 [249];
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  puVar37 = local_7f8;
  local_800 = root.ptr;
  auVar44 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar105 = ZEXT1664(auVar44);
  auVar44 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar106 = ZEXT1664(auVar44);
  uVar7 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar97 = ZEXT1664(CONCAT412(uVar7,CONCAT48(uVar7,CONCAT44(uVar7,uVar7))));
  fVar8 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar9 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar10 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar20 = fVar8 * 0.99999964;
  fVar21 = fVar9 * 0.99999964;
  fVar22 = fVar10 * 0.99999964;
  fVar8 = fVar8 * 1.0000004;
  fVar9 = fVar9 * 1.0000004;
  fVar10 = fVar10 * 1.0000004;
  uVar38 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_b18 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar31 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar40 = local_b18 ^ 0x10;
  iVar32 = (tray->tnear).field_0.i[k];
  auVar101 = ZEXT1664(CONCAT412(iVar32,CONCAT48(iVar32,CONCAT44(iVar32,iVar32))));
  iVar32 = (tray->tfar).field_0.i[k];
  auVar103 = ZEXT1664(CONCAT412(iVar32,CONCAT48(iVar32,CONCAT44(iVar32,iVar32))));
  local_aa0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  bVar42 = true;
  auVar44 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
  auVar104 = ZEXT1664(auVar44);
  do {
    uVar39 = puVar37[-1];
    puVar37 = puVar37 + -1;
    while( true ) {
      auVar100 = auVar101._0_16_;
      auVar44 = auVar97._0_16_;
      auVar102 = auVar103._0_16_;
      if ((uVar39 & 8) != 0) break;
      uVar27 = uVar39 & 0xfffffffffffffff0;
      uVar7 = *(undefined4 *)(ray + k * 4 + 0x70);
      auVar53._4_4_ = uVar7;
      auVar53._0_4_ = uVar7;
      auVar53._8_4_ = uVar7;
      auVar53._12_4_ = uVar7;
      auVar45 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar27 + 0x80 + uVar38),auVar53,
                                *(undefined1 (*) [16])(uVar27 + 0x20 + uVar38));
      auVar45 = vsubps_avx512vl(auVar45,auVar105._0_16_);
      auVar56._0_4_ = fVar20 * auVar45._0_4_;
      auVar56._4_4_ = fVar20 * auVar45._4_4_;
      auVar56._8_4_ = fVar20 * auVar45._8_4_;
      auVar56._12_4_ = fVar20 * auVar45._12_4_;
      auVar100 = vmaxps_avx(auVar100,auVar56);
      auVar45 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar27 + 0x80 + local_b18),auVar53,
                                *(undefined1 (*) [16])(uVar27 + 0x20 + local_b18));
      auVar45 = vsubps_avx512vl(auVar45,auVar106._0_16_);
      auVar59._0_4_ = fVar21 * auVar45._0_4_;
      auVar59._4_4_ = fVar21 * auVar45._4_4_;
      auVar59._8_4_ = fVar21 * auVar45._8_4_;
      auVar59._12_4_ = fVar21 * auVar45._12_4_;
      auVar45 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar27 + 0x80 + uVar31),auVar53,
                                *(undefined1 (*) [16])(uVar27 + 0x20 + uVar31));
      auVar45 = vsubps_avx(auVar45,auVar44);
      auVar70._0_4_ = fVar22 * auVar45._0_4_;
      auVar70._4_4_ = fVar22 * auVar45._4_4_;
      auVar70._8_4_ = fVar22 * auVar45._8_4_;
      auVar70._12_4_ = fVar22 * auVar45._12_4_;
      auVar45 = vmaxps_avx(auVar59,auVar70);
      auVar100 = vmaxps_avx(auVar100,auVar45);
      auVar45 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar27 + 0x80 + (uVar38 ^ 0x10)),auVar53,
                                *(undefined1 (*) [16])(uVar27 + 0x20 + (uVar38 ^ 0x10)));
      auVar45 = vsubps_avx512vl(auVar45,auVar105._0_16_);
      auVar62._0_4_ = fVar8 * auVar45._0_4_;
      auVar62._4_4_ = fVar8 * auVar45._4_4_;
      auVar62._8_4_ = fVar8 * auVar45._8_4_;
      auVar62._12_4_ = fVar8 * auVar45._12_4_;
      auVar102 = vminps_avx(auVar102,auVar62);
      auVar45 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar27 + 0x80 + uVar40),auVar53,
                                *(undefined1 (*) [16])(uVar27 + 0x20 + uVar40));
      auVar45 = vsubps_avx512vl(auVar45,auVar106._0_16_);
      auVar66._0_4_ = fVar9 * auVar45._0_4_;
      auVar66._4_4_ = fVar9 * auVar45._4_4_;
      auVar66._8_4_ = fVar9 * auVar45._8_4_;
      auVar66._12_4_ = fVar9 * auVar45._12_4_;
      auVar45 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar27 + 0x80 + (uVar31 ^ 0x10)),auVar53,
                                *(undefined1 (*) [16])(uVar27 + 0x20 + (uVar31 ^ 0x10)));
      auVar44 = vsubps_avx(auVar45,auVar44);
      auVar45._0_4_ = fVar10 * auVar44._0_4_;
      auVar45._4_4_ = fVar10 * auVar44._4_4_;
      auVar45._8_4_ = fVar10 * auVar44._8_4_;
      auVar45._12_4_ = fVar10 * auVar44._12_4_;
      auVar44 = vminps_avx(auVar66,auVar45);
      auVar44 = vminps_avx(auVar102,auVar44);
      uVar23 = vcmpps_avx512vl(auVar100,auVar44,2);
      uVar35 = (uint)uVar23;
      if (((uint)uVar39 & 7) == 6) {
        uVar24 = vcmpps_avx512vl(auVar53,*(undefined1 (*) [16])(uVar27 + 0xf0),1);
        uVar25 = vcmpps_avx512vl(auVar53,*(undefined1 (*) [16])(uVar27 + 0xe0),0xd);
        uVar35 = (uint)(byte)((byte)uVar24 & (byte)uVar25 & (byte)uVar23);
      }
      if ((byte)uVar35 == 0) goto LAB_006e6095;
      lVar29 = 0;
      for (uVar39 = (ulong)(byte)uVar35; (uVar39 & 1) == 0;
          uVar39 = uVar39 >> 1 | 0x8000000000000000) {
        lVar29 = lVar29 + 1;
      }
      uVar39 = *(ulong *)(uVar27 + lVar29 * 8);
      uVar35 = (uVar35 & 0xff) - 1 & uVar35 & 0xff;
      uVar33 = (ulong)uVar35;
      if (uVar35 != 0) {
        *puVar37 = uVar39;
        lVar29 = 0;
        for (; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000) {
          lVar29 = lVar29 + 1;
        }
        uVar35 = uVar35 - 1 & uVar35;
        uVar33 = (ulong)uVar35;
        bVar41 = uVar35 == 0;
        while( true ) {
          puVar37 = puVar37 + 1;
          uVar39 = *(ulong *)(uVar27 + lVar29 * 8);
          if (bVar41) break;
          *puVar37 = uVar39;
          lVar29 = 0;
          for (uVar39 = uVar33; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x8000000000000000) {
            lVar29 = lVar29 + 1;
          }
          uVar33 = uVar33 - 1 & uVar33;
          bVar41 = uVar33 == 0;
        }
      }
    }
    local_b28 = (ulong)((uint)uVar39 & 0xf) - 8;
    if (local_b28 != 0) {
      uVar39 = uVar39 & 0xfffffffffffffff0;
      local_b20 = 0;
      do {
        lVar36 = local_b20 * 0x60;
        pSVar14 = context->scene;
        pRVar15 = (pSVar14->geometries).items;
        pGVar16 = pRVar15[*(uint *)(uVar39 + 0x40 + lVar36)].ptr;
        fVar11 = (pGVar16->time_range).lower;
        fVar11 = pGVar16->fnumTimeSegments *
                 ((*(float *)(ray + k * 4 + 0x70) - fVar11) / ((pGVar16->time_range).upper - fVar11)
                 );
        auVar45 = vroundss_avx(ZEXT416((uint)fVar11),ZEXT416((uint)fVar11),9);
        auVar46 = vaddss_avx512f(ZEXT416((uint)pGVar16->fnumTimeSegments),
                                 SUB6416(ZEXT464(0xbf800000),0));
        auVar45 = vminss_avx(auVar45,auVar46);
        auVar47 = vmaxss_avx512f(auVar104._0_16_,auVar45);
        iVar32 = (int)auVar47._0_4_;
        lVar30 = (long)iVar32 * 0x38;
        lVar29 = *(long *)(*(long *)&pGVar16[2].numPrimitives + lVar30);
        auVar45 = *(undefined1 (*) [16])(lVar29 + (ulong)*(uint *)(uVar39 + lVar36) * 4);
        uVar33 = (ulong)*(uint *)(uVar39 + 0x10 + lVar36);
        auVar46 = *(undefined1 (*) [16])(lVar29 + uVar33 * 4);
        uVar43 = (ulong)*(uint *)(uVar39 + 0x20 + lVar36);
        auVar53 = *(undefined1 (*) [16])(lVar29 + uVar43 * 4);
        uVar34 = (ulong)*(uint *)(uVar39 + 0x30 + lVar36);
        auVar56 = *(undefined1 (*) [16])(lVar29 + uVar34 * 4);
        uVar27 = (ulong)*(uint *)(uVar39 + 4 + lVar36);
        lVar28 = (long)(iVar32 + 1) * 0x38;
        lVar29 = *(long *)(*(long *)&pGVar16[2].numPrimitives + lVar28);
        auVar59 = *(undefined1 (*) [16])(lVar29 + (ulong)*(uint *)(uVar39 + lVar36) * 4);
        auVar62 = *(undefined1 (*) [16])(lVar29 + uVar33 * 4);
        lVar17 = *(long *)&pRVar15[*(uint *)(uVar39 + 0x44 + lVar36)].ptr[2].numPrimitives;
        lVar18 = *(long *)(lVar17 + lVar30);
        auVar70 = *(undefined1 (*) [16])(lVar18 + uVar27 * 4);
        auVar66 = *(undefined1 (*) [16])(lVar29 + uVar43 * 4);
        uVar43 = (ulong)*(uint *)(uVar39 + 0x14 + lVar36);
        auVar71 = *(undefined1 (*) [16])(lVar18 + uVar43 * 4);
        auVar68 = *(undefined1 (*) [16])(lVar29 + uVar34 * 4);
        uVar33 = (ulong)*(uint *)(uVar39 + 0x24 + lVar36);
        auVar55 = *(undefined1 (*) [16])(lVar18 + uVar33 * 4);
        uVar34 = (ulong)*(uint *)(uVar39 + 0x34 + lVar36);
        auVar58 = *(undefined1 (*) [16])(lVar18 + uVar34 * 4);
        lVar29 = *(long *)&pRVar15[*(uint *)(uVar39 + 0x48 + lVar36)].ptr[2].numPrimitives;
        lVar17 = *(long *)(lVar17 + lVar28);
        auVar61 = *(undefined1 (*) [16])(lVar17 + uVar27 * 4);
        lVar18 = *(long *)(lVar29 + lVar30);
        auVar63 = *(undefined1 (*) [16])(lVar17 + uVar43 * 4);
        uVar43 = (ulong)*(uint *)(uVar39 + 8 + lVar36);
        auVar12 = *(undefined1 (*) [16])(lVar18 + uVar43 * 4);
        auVar67 = *(undefined1 (*) [16])(lVar17 + uVar33 * 4);
        uVar33 = (ulong)*(uint *)(uVar39 + 0x18 + lVar36);
        auVar13 = *(undefined1 (*) [16])(lVar18 + uVar33 * 4);
        auVar69 = *(undefined1 (*) [16])(lVar17 + uVar34 * 4);
        uVar27 = (ulong)*(uint *)(uVar39 + 0x28 + lVar36);
        auVar54 = *(undefined1 (*) [16])(lVar18 + uVar27 * 4);
        uVar34 = (ulong)*(uint *)(uVar39 + 0x38 + lVar36);
        auVar57 = *(undefined1 (*) [16])(lVar18 + uVar34 * 4);
        lVar29 = *(long *)(lVar29 + lVar28);
        auVar60 = *(undefined1 (*) [16])(lVar29 + uVar43 * 4);
        lVar17 = *(long *)&pRVar15[*(uint *)(uVar39 + 0x4c + lVar36)].ptr[2].numPrimitives;
        lVar18 = *(long *)(lVar17 + lVar30);
        auVar64 = *(undefined1 (*) [16])(lVar29 + uVar33 * 4);
        uVar33 = (ulong)*(uint *)(uVar39 + 0xc + lVar36);
        auVar50 = *(undefined1 (*) [16])(lVar18 + uVar33 * 4);
        auVar65 = *(undefined1 (*) [16])(lVar29 + uVar27 * 4);
        uVar43 = (ulong)*(uint *)(uVar39 + 0x1c + lVar36);
        auVar52 = *(undefined1 (*) [16])(lVar18 + uVar43 * 4);
        auVar48 = vunpcklps_avx512vl(auVar45,auVar12);
        auVar12 = vunpckhps_avx(auVar45,auVar12);
        auVar49 = vunpcklps_avx512vl(auVar70,auVar50);
        auVar70 = vunpckhps_avx(auVar70,auVar50);
        auVar45 = *(undefined1 (*) [16])(lVar29 + uVar34 * 4);
        uVar27 = (ulong)*(uint *)(uVar39 + 0x2c + lVar36);
        auVar12 = vunpcklps_avx(auVar12,auVar70);
        auVar50 = vunpcklps_avx512vl(auVar48,auVar49);
        auVar48 = vunpckhps_avx512vl(auVar48,auVar49);
        auVar49 = vunpcklps_avx512vl(auVar46,auVar13);
        auVar51 = vunpckhps_avx512vl(auVar46,auVar13);
        auVar13 = vunpcklps_avx(auVar71,auVar52);
        auVar70 = vunpckhps_avx(auVar71,auVar52);
        auVar46 = *(undefined1 (*) [16])(lVar18 + uVar27 * 4);
        uVar34 = (ulong)*(uint *)(uVar39 + 0x3c + lVar36);
        auVar71 = vunpcklps_avx(auVar51,auVar70);
        auVar52 = vunpcklps_avx512vl(auVar49,auVar13);
        auVar70 = vunpckhps_avx(auVar49,auVar13);
        auVar49 = vunpcklps_avx512vl(auVar53,auVar54);
        auVar53 = vunpckhps_avx512vl(auVar53,auVar54);
        auVar54 = vunpcklps_avx512vl(auVar55,auVar46);
        auVar55 = vunpckhps_avx512vl(auVar55,auVar46);
        auVar46 = *(undefined1 (*) [16])(lVar18 + uVar34 * 4);
        lVar29 = *(long *)(lVar17 + lVar28);
        auVar55 = vunpcklps_avx(auVar53,auVar55);
        auVar13 = vunpcklps_avx(auVar49,auVar54);
        auVar53 = vunpckhps_avx(auVar49,auVar54);
        auVar54 = vunpcklps_avx512vl(auVar56,auVar57);
        auVar56 = vunpckhps_avx512vl(auVar56,auVar57);
        auVar57 = vunpcklps_avx512vl(auVar58,auVar46);
        auVar58 = vunpckhps_avx512vl(auVar58,auVar46);
        auVar46 = *(undefined1 (*) [16])(lVar29 + uVar33 * 4);
        auVar56 = vunpcklps_avx(auVar56,auVar58);
        auVar58 = vunpcklps_avx512vl(auVar54,auVar57);
        auVar54 = vunpckhps_avx512vl(auVar54,auVar57);
        auVar57 = vunpcklps_avx512vl(auVar59,auVar60);
        auVar59 = vunpckhps_avx512vl(auVar59,auVar60);
        auVar60 = vunpcklps_avx512vl(auVar61,auVar46);
        auVar61 = vunpckhps_avx512vl(auVar61,auVar46);
        auVar46 = *(undefined1 (*) [16])(lVar29 + uVar43 * 4);
        auVar61 = vunpcklps_avx512vl(auVar59,auVar61);
        auVar49 = vunpcklps_avx512vl(auVar57,auVar60);
        auVar57 = vunpckhps_avx512vl(auVar57,auVar60);
        auVar59 = vunpcklps_avx512vl(auVar62,auVar64);
        auVar62 = vunpckhps_avx512vl(auVar62,auVar64);
        auVar60 = vunpcklps_avx512vl(auVar63,auVar46);
        auVar63 = vunpckhps_avx512vl(auVar63,auVar46);
        auVar46 = *(undefined1 (*) [16])(lVar29 + uVar27 * 4);
        auVar62 = vunpcklps_avx512vl(auVar62,auVar63);
        auVar63 = vunpcklps_avx512vl(auVar59,auVar60);
        auVar60 = vunpckhps_avx512vl(auVar59,auVar60);
        auVar64 = vunpcklps_avx512vl(auVar66,auVar65);
        auVar59 = vunpckhps_avx512vl(auVar66,auVar65);
        auVar65 = vxorps_avx512vl(auVar65,auVar65);
        auVar66 = vunpcklps_avx512vl(auVar67,auVar46);
        auVar67 = vunpckhps_avx512vl(auVar67,auVar46);
        auVar46 = *(undefined1 (*) [16])(lVar29 + uVar34 * 4);
        auVar59 = vunpcklps_avx(auVar59,auVar67);
        auVar67 = vunpcklps_avx512vl(auVar64,auVar66);
        auVar66 = vunpckhps_avx512vl(auVar64,auVar66);
        auVar64 = vunpcklps_avx512vl(auVar68,auVar45);
        auVar45 = vunpckhps_avx512vl(auVar68,auVar45);
        auVar68 = vunpcklps_avx512vl(auVar69,auVar46);
        auVar46 = vunpckhps_avx512vl(auVar69,auVar46);
        auVar45 = vunpcklps_avx(auVar45,auVar46);
        auVar69 = vunpcklps_avx512vl(auVar64,auVar68);
        auVar68 = vunpckhps_avx512vl(auVar64,auVar68);
        auVar46 = ZEXT416((uint)(fVar11 - auVar47._0_4_));
        auVar64 = vbroadcastss_avx512vl(auVar46);
        auVar46 = vsubss_avx512f(ZEXT416(0x3f800000),auVar46);
        auVar72 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
        auVar47._0_4_ = auVar46._0_4_;
        auVar47._4_4_ = auVar47._0_4_;
        auVar47._8_4_ = auVar47._0_4_;
        auVar47._12_4_ = auVar47._0_4_;
        auVar46 = vmulps_avx512vl(auVar64,auVar49);
        auVar50 = vfmadd231ps_avx512vl(auVar46,auVar47,auVar50);
        auVar46 = vmulps_avx512vl(auVar64,auVar57);
        auVar57 = vfmadd231ps_avx512vl(auVar46,auVar47,auVar48);
        auVar46 = vmulps_avx512vl(auVar64,auVar61);
        auVar46 = vfmadd231ps_fma(auVar46,auVar47,auVar12);
        auVar61 = vmulps_avx512vl(auVar64,auVar63);
        auVar61 = vfmadd231ps_avx512vl(auVar61,auVar47,auVar52);
        auVar73 = vbroadcasti32x4_avx512vl(*(undefined1 (*) [16])(uVar39 + 0x10 + lVar36));
        local_9e0 = vmovdqa64_avx512vl(auVar73);
        auVar73 = vbroadcasti32x4_avx512vl(*(undefined1 (*) [16])(uVar39 + 0x14 + lVar36));
        auVar63 = vmulps_avx512vl(auVar64,auVar60);
        auVar62 = vmulps_avx512vl(auVar64,auVar62);
        auVar63 = vfmadd231ps_avx512vl(auVar63,auVar47,auVar70);
        auVar62 = vfmadd231ps_fma(auVar62,auVar47,auVar71);
        auVar70 = vmulps_avx512vl(auVar64,auVar67);
        auVar66 = vmulps_avx512vl(auVar64,auVar66);
        auVar71 = vmulps_avx512vl(auVar64,auVar59);
        auVar59 = vfmadd231ps_fma(auVar70,auVar47,auVar13);
        auVar53 = vfmadd231ps_fma(auVar66,auVar47,auVar53);
        auVar70 = vfmadd231ps_fma(auVar71,auVar47,auVar55);
        auVar66 = vmulps_avx512vl(auVar64,auVar69);
        auVar71 = vmulps_avx512vl(auVar64,auVar68);
        auVar68 = vmulps_avx512vl(auVar64,auVar45);
        auVar74 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar45 = vfmadd231ps_fma(auVar66,auVar47,auVar58);
        auVar66 = vfmadd231ps_fma(auVar71,auVar47,auVar54);
        auVar56 = vfmadd231ps_fma(auVar68,auVar47,auVar56);
        local_a00 = vmovdqa64_avx512vl(auVar73);
        auVar73 = vinsertf32x4_avx512vl(ZEXT1632(auVar50),auVar59,1);
        auVar75 = vinsertf32x4_avx512vl(ZEXT1632(auVar57),auVar53,1);
        auVar79._16_16_ = auVar70;
        auVar79._0_16_ = auVar46;
        auVar80._16_16_ = auVar61;
        auVar80._0_16_ = auVar61;
        auVar76 = vinsertf32x4_avx512vl(ZEXT1632(auVar63),auVar63,1);
        auVar82._16_16_ = auVar62;
        auVar82._0_16_ = auVar62;
        auVar93._16_16_ = auVar45;
        auVar93._0_16_ = auVar45;
        auVar83._16_16_ = auVar66;
        auVar83._0_16_ = auVar66;
        uVar7 = *(undefined4 *)(ray + k * 4);
        auVar84._4_4_ = uVar7;
        auVar84._0_4_ = uVar7;
        auVar84._8_4_ = uVar7;
        auVar84._12_4_ = uVar7;
        auVar84._16_4_ = uVar7;
        auVar84._20_4_ = uVar7;
        auVar84._24_4_ = uVar7;
        auVar84._28_4_ = uVar7;
        uVar7 = *(undefined4 *)(ray + k * 4 + 0x10);
        auVar85._4_4_ = uVar7;
        auVar85._0_4_ = uVar7;
        auVar85._8_4_ = uVar7;
        auVar85._12_4_ = uVar7;
        auVar85._16_4_ = uVar7;
        auVar85._20_4_ = uVar7;
        auVar85._24_4_ = uVar7;
        auVar85._28_4_ = uVar7;
        auVar77 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x20)));
        uVar7 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar96._4_4_ = uVar7;
        auVar96._0_4_ = uVar7;
        auVar96._8_4_ = uVar7;
        auVar96._12_4_ = uVar7;
        auVar96._16_4_ = uVar7;
        auVar96._20_4_ = uVar7;
        auVar96._24_4_ = uVar7;
        auVar96._28_4_ = uVar7;
        auVar78 = vinsertf32x4_avx512vl(ZEXT1632(auVar56),auVar56,1);
        uVar7 = *(undefined4 *)(ray + k * 4 + 0x50);
        auVar98._4_4_ = uVar7;
        auVar98._0_4_ = uVar7;
        auVar98._8_4_ = uVar7;
        auVar98._12_4_ = uVar7;
        auVar98._16_4_ = uVar7;
        auVar98._20_4_ = uVar7;
        auVar98._24_4_ = uVar7;
        auVar98._28_4_ = uVar7;
        fVar11 = *(float *)(ray + k * 4 + 0x60);
        auVar99._4_4_ = fVar11;
        auVar99._0_4_ = fVar11;
        auVar99._8_4_ = fVar11;
        auVar99._12_4_ = fVar11;
        auVar99._16_4_ = fVar11;
        auVar99._20_4_ = fVar11;
        auVar99._24_4_ = fVar11;
        auVar99._28_4_ = fVar11;
        auVar73 = vsubps_avx(auVar73,auVar84);
        auVar75 = vsubps_avx(auVar75,auVar85);
        auVar79 = vsubps_avx512vl(auVar79,auVar77);
        auVar80 = vsubps_avx512vl(auVar80,auVar84);
        auVar81 = vsubps_avx512vl(auVar76,auVar85);
        auVar82 = vsubps_avx512vl(auVar82,auVar77);
        auVar76 = vsubps_avx(auVar93,auVar84);
        auVar93 = vsubps_avx(auVar83,auVar85);
        auVar83 = vsubps_avx512vl(auVar78,auVar77);
        auVar77 = vsubps_avx(auVar76,auVar73);
        auVar78 = vsubps_avx(auVar93,auVar75);
        auVar84 = vsubps_avx512vl(auVar83,auVar79);
        auVar85 = vsubps_avx512vl(auVar73,auVar80);
        auVar86 = vsubps_avx512vl(auVar75,auVar81);
        auVar87 = vsubps_avx512vl(auVar79,auVar82);
        auVar56 = auVar87._0_16_;
        auVar92._0_4_ = auVar76._0_4_ + auVar73._0_4_;
        auVar92._4_4_ = auVar76._4_4_ + auVar73._4_4_;
        auVar92._8_4_ = auVar76._8_4_ + auVar73._8_4_;
        auVar92._12_4_ = auVar76._12_4_ + auVar73._12_4_;
        auVar92._16_4_ = auVar76._16_4_ + auVar73._16_4_;
        auVar92._20_4_ = auVar76._20_4_ + auVar73._20_4_;
        auVar92._24_4_ = auVar76._24_4_ + auVar73._24_4_;
        auVar92._28_4_ = auVar76._28_4_ + auVar73._28_4_;
        auVar95._0_4_ = auVar93._0_4_ + auVar75._0_4_;
        auVar95._4_4_ = auVar93._4_4_ + auVar75._4_4_;
        auVar95._8_4_ = auVar93._8_4_ + auVar75._8_4_;
        auVar95._12_4_ = auVar93._12_4_ + auVar75._12_4_;
        auVar95._16_4_ = auVar93._16_4_ + auVar75._16_4_;
        auVar95._20_4_ = auVar93._20_4_ + auVar75._20_4_;
        auVar95._24_4_ = auVar93._24_4_ + auVar75._24_4_;
        auVar95._28_4_ = auVar93._28_4_ + auVar75._28_4_;
        auVar88 = vaddps_avx512vl(auVar83,auVar79);
        auVar89._4_4_ = auVar84._4_4_ * auVar95._4_4_;
        auVar89._0_4_ = auVar84._0_4_ * auVar95._0_4_;
        auVar89._8_4_ = auVar84._8_4_ * auVar95._8_4_;
        auVar89._12_4_ = auVar84._12_4_ * auVar95._12_4_;
        auVar89._16_4_ = auVar84._16_4_ * auVar95._16_4_;
        auVar89._20_4_ = auVar84._20_4_ * auVar95._20_4_;
        auVar89._24_4_ = auVar84._24_4_ * auVar95._24_4_;
        auVar89._28_4_ = auVar66._12_4_;
        auVar46 = vfmsub231ps_fma(auVar89,auVar78,auVar88);
        auVar90._4_4_ = auVar77._4_4_ * auVar88._4_4_;
        auVar90._0_4_ = auVar77._0_4_ * auVar88._0_4_;
        auVar90._8_4_ = auVar77._8_4_ * auVar88._8_4_;
        auVar90._12_4_ = auVar77._12_4_ * auVar88._12_4_;
        auVar90._16_4_ = auVar77._16_4_ * auVar88._16_4_;
        auVar90._20_4_ = auVar77._20_4_ * auVar88._20_4_;
        auVar90._24_4_ = auVar77._24_4_ * auVar88._24_4_;
        auVar90._28_4_ = auVar88._28_4_;
        auVar45 = vfmsub231ps_fma(auVar90,auVar84,auVar92);
        auVar88._4_4_ = auVar78._4_4_ * auVar92._4_4_;
        auVar88._0_4_ = auVar78._0_4_ * auVar92._0_4_;
        auVar88._8_4_ = auVar78._8_4_ * auVar92._8_4_;
        auVar88._12_4_ = auVar78._12_4_ * auVar92._12_4_;
        auVar88._16_4_ = auVar78._16_4_ * auVar92._16_4_;
        auVar88._20_4_ = auVar78._20_4_ * auVar92._20_4_;
        auVar88._24_4_ = auVar78._24_4_ * auVar92._24_4_;
        auVar88._28_4_ = auVar92._28_4_;
        auVar53 = vfmsub231ps_fma(auVar88,auVar77,auVar95);
        auVar94._0_4_ = fVar11 * auVar53._0_4_;
        auVar94._4_4_ = fVar11 * auVar53._4_4_;
        auVar94._8_4_ = fVar11 * auVar53._8_4_;
        auVar94._12_4_ = fVar11 * auVar53._12_4_;
        auVar94._16_4_ = fVar11 * 0.0;
        auVar94._20_4_ = fVar11 * 0.0;
        auVar94._24_4_ = fVar11 * 0.0;
        auVar94._28_4_ = 0;
        auVar45 = vfmadd231ps_fma(auVar94,auVar98,ZEXT1632(auVar45));
        auVar45 = vfmadd231ps_fma(ZEXT1632(auVar45),auVar96,ZEXT1632(auVar46));
        auVar89 = vaddps_avx512vl(auVar73,auVar80);
        auVar90 = vaddps_avx512vl(auVar75,auVar81);
        auVar88 = vaddps_avx512vl(auVar79,auVar82);
        auVar91 = vmulps_avx512vl(auVar90,auVar87);
        auVar92 = vfmsub231ps_avx512vl(auVar91,auVar86,auVar88);
        auVar88 = vmulps_avx512vl(auVar88,auVar85);
        auVar88 = vfmsub231ps_avx512vl(auVar88,auVar87,auVar89);
        auVar89 = vmulps_avx512vl(auVar89,auVar86);
        auVar89 = vfmsub231ps_avx512vl(auVar89,auVar85,auVar90);
        auVar90 = vsubps_avx512vl(auVar80,auVar76);
        auVar91._4_4_ = fVar11 * auVar89._4_4_;
        auVar91._0_4_ = fVar11 * auVar89._0_4_;
        auVar91._8_4_ = fVar11 * auVar89._8_4_;
        auVar91._12_4_ = fVar11 * auVar89._12_4_;
        auVar91._16_4_ = fVar11 * auVar89._16_4_;
        auVar91._20_4_ = fVar11 * auVar89._20_4_;
        auVar91._24_4_ = fVar11 * auVar89._24_4_;
        auVar91._28_4_ = auVar89._28_4_;
        auVar46 = vfmadd231ps_fma(auVar91,auVar98,auVar88);
        auVar89 = vsubps_avx512vl(auVar81,auVar93);
        local_9a0 = vfmadd231ps_avx512vl(ZEXT1632(auVar46),auVar96,auVar92);
        auVar88 = vsubps_avx512vl(auVar82,auVar83);
        auVar91 = vaddps_avx512vl(auVar80,auVar76);
        auVar93 = vaddps_avx512vl(auVar81,auVar93);
        auVar76 = vaddps_avx512vl(auVar82,auVar83);
        auVar80 = vmulps_avx512vl(auVar93,auVar88);
        auVar80 = vfmsub231ps_avx512vl(auVar80,auVar89,auVar76);
        auVar76 = vmulps_avx512vl(auVar76,auVar90);
        auVar81 = vfmsub231ps_avx512vl(auVar76,auVar88,auVar91);
        auVar76._4_4_ = auVar91._4_4_ * auVar89._4_4_;
        auVar76._0_4_ = auVar91._0_4_ * auVar89._0_4_;
        auVar76._8_4_ = auVar91._8_4_ * auVar89._8_4_;
        auVar76._12_4_ = auVar91._12_4_ * auVar89._12_4_;
        auVar76._16_4_ = auVar91._16_4_ * auVar89._16_4_;
        auVar76._20_4_ = auVar91._20_4_ * auVar89._20_4_;
        auVar76._24_4_ = auVar91._24_4_ * auVar89._24_4_;
        auVar76._28_4_ = auVar91._28_4_;
        auVar46 = vfmsub231ps_fma(auVar76,auVar90,auVar93);
        auVar76 = vmulps_avx512vl(ZEXT1632(auVar46),auVar99);
        auVar76 = vfmadd231ps_avx512vl(auVar76,auVar98,auVar81);
        auVar76 = vfmadd231ps_avx512vl(auVar76,auVar96,auVar80);
        auVar81._0_4_ = auVar45._0_4_ + local_9a0._0_4_;
        auVar81._4_4_ = auVar45._4_4_ + local_9a0._4_4_;
        auVar81._8_4_ = auVar45._8_4_ + local_9a0._8_4_;
        auVar81._12_4_ = auVar45._12_4_ + local_9a0._12_4_;
        auVar81._16_4_ = local_9a0._16_4_ + 0.0;
        auVar81._20_4_ = local_9a0._20_4_ + 0.0;
        auVar81._24_4_ = local_9a0._24_4_ + 0.0;
        auVar81._28_4_ = local_9a0._28_4_ + 0.0;
        local_980 = vaddps_avx512vl(auVar76,auVar81);
        vandps_avx512vl(local_980,auVar74);
        auVar93 = vmulps_avx512vl(local_980,auVar72);
        auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar72 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        local_9c0 = ZEXT1632(auVar45);
        auVar80 = vminps_avx512vl(local_9c0,local_9a0);
        auVar80 = vminps_avx512vl(auVar80,auVar76);
        auVar72 = vxorps_avx512vl(auVar93,auVar72);
        uVar23 = vcmpps_avx512vl(auVar80,auVar72,5);
        auVar72 = vmaxps_avx512vl(local_9c0,local_9a0);
        auVar76 = vmaxps_avx512vl(auVar72,auVar76);
        uVar24 = vcmpps_avx512vl(auVar76,auVar93,2);
        bVar26 = (byte)uVar23 | (byte)uVar24;
        if (bVar26 == 0) {
LAB_006e6013:
          auVar45 = vxorps_avx512vl(auVar56,auVar56);
          auVar104 = ZEXT1664(auVar45);
        }
        else {
          auVar76 = vmulps_avx512vl(auVar86,auVar84);
          auVar93 = vmulps_avx512vl(auVar77,auVar87);
          auVar72 = vmulps_avx512vl(auVar85,auVar78);
          auVar80 = vmulps_avx512vl(auVar89,auVar87);
          auVar81 = vmulps_avx512vl(auVar85,auVar88);
          auVar82 = vmulps_avx512vl(auVar90,auVar86);
          auVar78 = vfmsub213ps_avx512vl(auVar78,auVar87,auVar76);
          auVar83 = vfmsub213ps_avx512vl(auVar84,auVar85,auVar93);
          auVar77 = vfmsub213ps_avx512vl(auVar77,auVar86,auVar72);
          auVar88 = vfmsub213ps_avx512vl(auVar88,auVar86,auVar80);
          auVar90 = vfmsub213ps_avx512vl(auVar90,auVar87,auVar81);
          auVar89 = vfmsub213ps_avx512vl(auVar89,auVar85,auVar82);
          vandps_avx512vl(auVar76,auVar74);
          vandps_avx512vl(auVar80,auVar74);
          uVar27 = vcmpps_avx512vl(auVar89,auVar89,1);
          vandps_avx512vl(auVar93,auVar74);
          vandps_avx512vl(auVar81,auVar74);
          uVar33 = vcmpps_avx512vl(auVar89,auVar89,1);
          vandps_avx512vl(auVar72,auVar74);
          auVar56 = auVar89._0_16_;
          vandps_avx512vl(auVar82,auVar74);
          uVar43 = vcmpps_avx512vl(auVar89,auVar89,1);
          bVar41 = (bool)((byte)uVar27 & 1);
          local_960._0_4_ = (float)((uint)bVar41 * auVar78._0_4_ | (uint)!bVar41 * auVar88._0_4_);
          bVar41 = (bool)((byte)(uVar27 >> 1) & 1);
          local_960._4_4_ = (float)((uint)bVar41 * auVar78._4_4_ | (uint)!bVar41 * auVar88._4_4_);
          bVar41 = (bool)((byte)(uVar27 >> 2) & 1);
          local_960._8_4_ = (float)((uint)bVar41 * auVar78._8_4_ | (uint)!bVar41 * auVar88._8_4_);
          bVar41 = (bool)((byte)(uVar27 >> 3) & 1);
          local_960._12_4_ = (float)((uint)bVar41 * auVar78._12_4_ | (uint)!bVar41 * auVar88._12_4_)
          ;
          bVar41 = (bool)((byte)(uVar27 >> 4) & 1);
          local_960._16_4_ = (float)((uint)bVar41 * auVar78._16_4_ | (uint)!bVar41 * auVar88._16_4_)
          ;
          bVar41 = (bool)((byte)(uVar27 >> 5) & 1);
          local_960._20_4_ = (float)((uint)bVar41 * auVar78._20_4_ | (uint)!bVar41 * auVar88._20_4_)
          ;
          bVar41 = (bool)((byte)(uVar27 >> 6) & 1);
          local_960._24_4_ = (float)((uint)bVar41 * auVar78._24_4_ | (uint)!bVar41 * auVar88._24_4_)
          ;
          bVar41 = SUB81(uVar27 >> 7,0);
          local_960._28_4_ = (uint)bVar41 * auVar78._28_4_ | (uint)!bVar41 * auVar88._28_4_;
          bVar41 = (bool)((byte)uVar33 & 1);
          local_940._0_4_ = (float)((uint)bVar41 * auVar83._0_4_ | (uint)!bVar41 * auVar90._0_4_);
          bVar41 = (bool)((byte)(uVar33 >> 1) & 1);
          local_940._4_4_ = (float)((uint)bVar41 * auVar83._4_4_ | (uint)!bVar41 * auVar90._4_4_);
          bVar41 = (bool)((byte)(uVar33 >> 2) & 1);
          local_940._8_4_ = (float)((uint)bVar41 * auVar83._8_4_ | (uint)!bVar41 * auVar90._8_4_);
          bVar41 = (bool)((byte)(uVar33 >> 3) & 1);
          local_940._12_4_ = (float)((uint)bVar41 * auVar83._12_4_ | (uint)!bVar41 * auVar90._12_4_)
          ;
          bVar41 = (bool)((byte)(uVar33 >> 4) & 1);
          local_940._16_4_ = (float)((uint)bVar41 * auVar83._16_4_ | (uint)!bVar41 * auVar90._16_4_)
          ;
          bVar41 = (bool)((byte)(uVar33 >> 5) & 1);
          local_940._20_4_ = (float)((uint)bVar41 * auVar83._20_4_ | (uint)!bVar41 * auVar90._20_4_)
          ;
          bVar41 = (bool)((byte)(uVar33 >> 6) & 1);
          local_940._24_4_ = (float)((uint)bVar41 * auVar83._24_4_ | (uint)!bVar41 * auVar90._24_4_)
          ;
          bVar41 = SUB81(uVar33 >> 7,0);
          local_940._28_4_ = (uint)bVar41 * auVar83._28_4_ | (uint)!bVar41 * auVar90._28_4_;
          bVar41 = (bool)((byte)uVar43 & 1);
          local_920._0_4_ = (float)((uint)bVar41 * auVar77._0_4_ | (uint)!bVar41 * auVar89._0_4_);
          bVar41 = (bool)((byte)(uVar43 >> 1) & 1);
          local_920._4_4_ = (float)((uint)bVar41 * auVar77._4_4_ | (uint)!bVar41 * auVar89._4_4_);
          bVar41 = (bool)((byte)(uVar43 >> 2) & 1);
          local_920._8_4_ = (float)((uint)bVar41 * auVar77._8_4_ | (uint)!bVar41 * auVar89._8_4_);
          bVar41 = (bool)((byte)(uVar43 >> 3) & 1);
          local_920._12_4_ = (float)((uint)bVar41 * auVar77._12_4_ | (uint)!bVar41 * auVar89._12_4_)
          ;
          bVar41 = (bool)((byte)(uVar43 >> 4) & 1);
          local_920._16_4_ = (float)((uint)bVar41 * auVar77._16_4_ | (uint)!bVar41 * auVar89._16_4_)
          ;
          bVar41 = (bool)((byte)(uVar43 >> 5) & 1);
          local_920._20_4_ = (float)((uint)bVar41 * auVar77._20_4_ | (uint)!bVar41 * auVar89._20_4_)
          ;
          bVar41 = (bool)((byte)(uVar43 >> 6) & 1);
          local_920._24_4_ = (float)((uint)bVar41 * auVar77._24_4_ | (uint)!bVar41 * auVar89._24_4_)
          ;
          bVar41 = SUB81(uVar43 >> 7,0);
          local_920._28_4_ = (uint)bVar41 * auVar77._28_4_ | (uint)!bVar41 * auVar89._28_4_;
          auVar77._4_4_ = fVar11 * local_920._4_4_;
          auVar77._0_4_ = fVar11 * local_920._0_4_;
          auVar77._8_4_ = fVar11 * local_920._8_4_;
          auVar77._12_4_ = fVar11 * local_920._12_4_;
          auVar77._16_4_ = fVar11 * local_920._16_4_;
          auVar77._20_4_ = fVar11 * local_920._20_4_;
          auVar77._24_4_ = fVar11 * local_920._24_4_;
          auVar77._28_4_ = fVar11;
          auVar46 = vfmadd213ps_fma(auVar98,local_940,auVar77);
          auVar46 = vfmadd213ps_fma(auVar96,local_960,ZEXT1632(auVar46));
          auVar76 = ZEXT1632(CONCAT412(auVar46._12_4_ + auVar46._12_4_,
                                       CONCAT48(auVar46._8_4_ + auVar46._8_4_,
                                                CONCAT44(auVar46._4_4_ + auVar46._4_4_,
                                                         auVar46._0_4_ + auVar46._0_4_))));
          auVar78._0_4_ = auVar79._0_4_ * local_920._0_4_;
          auVar78._4_4_ = auVar79._4_4_ * local_920._4_4_;
          auVar78._8_4_ = auVar79._8_4_ * local_920._8_4_;
          auVar78._12_4_ = auVar79._12_4_ * local_920._12_4_;
          auVar78._16_4_ = auVar79._16_4_ * local_920._16_4_;
          auVar78._20_4_ = auVar79._20_4_ * local_920._20_4_;
          auVar78._24_4_ = auVar79._24_4_ * local_920._24_4_;
          auVar78._28_4_ = 0;
          auVar46 = vfmadd213ps_fma(auVar75,local_940,auVar78);
          auVar53 = vfmadd213ps_fma(auVar73,local_960,ZEXT1632(auVar46));
          auVar73 = vrcp14ps_avx512vl(auVar76);
          auVar75 = vfnmadd213ps_avx512vl(auVar73,auVar76,auVar91);
          auVar46 = vfmadd132ps_fma(auVar75,auVar73,auVar73);
          auVar73 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x80)));
          auVar97 = ZEXT3264(auVar73);
          local_8a0 = ZEXT1632(CONCAT412(auVar46._12_4_ * (auVar53._12_4_ + auVar53._12_4_),
                                         CONCAT48(auVar46._8_4_ * (auVar53._8_4_ + auVar53._8_4_),
                                                  CONCAT44(auVar46._4_4_ *
                                                           (auVar53._4_4_ + auVar53._4_4_),
                                                           auVar46._0_4_ *
                                                           (auVar53._0_4_ + auVar53._0_4_)))));
          uVar23 = vcmpps_avx512vl(local_8a0,auVar73,2);
          uVar7 = *(undefined4 *)(ray + k * 4 + 0x30);
          auVar73._4_4_ = uVar7;
          auVar73._0_4_ = uVar7;
          auVar73._8_4_ = uVar7;
          auVar73._12_4_ = uVar7;
          auVar73._16_4_ = uVar7;
          auVar73._20_4_ = uVar7;
          auVar73._24_4_ = uVar7;
          auVar73._28_4_ = uVar7;
          uVar24 = vcmpps_avx512vl(local_8a0,auVar73,0xd);
          bVar26 = (byte)uVar23 & (byte)uVar24 & bVar26;
          if (bVar26 == 0) goto LAB_006e6013;
          uVar27 = vcmpps_avx512vl(auVar76,ZEXT1632(auVar65),4);
          uVar27 = bVar26 & uVar27;
          if ((char)uVar27 == '\0') goto LAB_006e6013;
          local_900 = (char)uVar27;
          local_820 = 0xf0;
          auVar74._8_4_ = 0x219392ef;
          auVar74._0_8_ = 0x219392ef219392ef;
          auVar74._12_4_ = 0x219392ef;
          auVar74._16_4_ = 0x219392ef;
          auVar74._20_4_ = 0x219392ef;
          auVar74._24_4_ = 0x219392ef;
          auVar74._28_4_ = 0x219392ef;
          uVar33 = vcmpps_avx512vl(local_980,auVar74,5);
          auVar73 = vrcp14ps_avx512vl(local_980);
          auVar75 = vfnmadd213ps_avx512vl(local_980,auVar73,auVar91);
          auVar75 = vfmadd132ps_avx512vl(auVar75,auVar73,auVar73);
          fVar1 = (float)((uint)((byte)uVar33 & 1) * auVar75._0_4_);
          fVar2 = (float)((uint)((byte)(uVar33 >> 1) & 1) * auVar75._4_4_);
          fVar3 = (float)((uint)((byte)(uVar33 >> 2) & 1) * auVar75._8_4_);
          fVar4 = (float)((uint)((byte)(uVar33 >> 3) & 1) * auVar75._12_4_);
          fVar5 = (float)((uint)((byte)(uVar33 >> 4) & 1) * auVar75._16_4_);
          fVar6 = (float)((uint)((byte)(uVar33 >> 5) & 1) * auVar75._20_4_);
          fVar11 = (float)((uint)((byte)(uVar33 >> 6) & 1) * auVar75._24_4_);
          auVar72._0_4_ = fVar1 * auVar45._0_4_;
          auVar72._4_4_ = fVar2 * auVar45._4_4_;
          auVar72._8_4_ = fVar3 * auVar45._8_4_;
          auVar72._12_4_ = fVar4 * auVar45._12_4_;
          auVar72._16_4_ = fVar5 * 0.0;
          auVar72._20_4_ = fVar6 * 0.0;
          auVar72._24_4_ = fVar11 * 0.0;
          auVar72._28_4_ = 0;
          auVar76 = vminps_avx512vl(auVar72,auVar91);
          auVar75._4_4_ = fVar2 * local_9a0._4_4_;
          auVar75._0_4_ = fVar1 * local_9a0._0_4_;
          auVar75._8_4_ = fVar3 * local_9a0._8_4_;
          auVar75._12_4_ = fVar4 * local_9a0._12_4_;
          auVar75._16_4_ = fVar5 * local_9a0._16_4_;
          auVar75._20_4_ = fVar6 * local_9a0._20_4_;
          auVar75._24_4_ = fVar11 * local_9a0._24_4_;
          auVar75._28_4_ = auVar73._28_4_;
          auVar73 = vminps_avx512vl(auVar75,auVar91);
          auVar75 = vsubps_avx512vl(auVar91,auVar76);
          auVar93 = vsubps_avx512vl(auVar91,auVar73);
          local_8c0 = vblendps_avx(auVar73,auVar75,0xf0);
          local_8e0 = vblendps_avx(auVar76,auVar93,0xf0);
          fVar11 = (float)DAT_01fef940;
          fVar6 = DAT_01fef940._4_4_;
          fVar5 = DAT_01fef940._8_4_;
          fVar1 = DAT_01fef940._12_4_;
          fVar4 = DAT_01fef940._16_4_;
          fVar3 = DAT_01fef940._20_4_;
          fVar2 = DAT_01fef940._24_4_;
          local_860._4_4_ = local_940._4_4_ * fVar6;
          local_860._0_4_ = local_940._0_4_ * fVar11;
          local_860._8_4_ = local_940._8_4_ * fVar5;
          local_860._12_4_ = local_940._12_4_ * fVar1;
          local_860._16_4_ = local_940._16_4_ * fVar4;
          local_860._20_4_ = local_940._20_4_ * fVar3;
          local_860._24_4_ = local_940._24_4_ * fVar2;
          local_860._28_4_ = local_940._28_4_;
          local_880[0] = local_960._0_4_ * fVar11;
          local_880[1] = local_960._4_4_ * fVar6;
          local_880[2] = local_960._8_4_ * fVar5;
          local_880[3] = local_960._12_4_ * fVar1;
          fStack_870 = local_960._16_4_ * fVar4;
          fStack_86c = local_960._20_4_ * fVar3;
          fStack_868 = local_960._24_4_ * fVar2;
          uStack_864 = local_8e0._28_4_;
          local_840._4_4_ = local_920._4_4_ * fVar6;
          local_840._0_4_ = local_920._0_4_ * fVar11;
          local_840._8_4_ = local_920._8_4_ * fVar5;
          local_840._12_4_ = local_920._12_4_ * fVar1;
          local_840._16_4_ = local_920._16_4_ * fVar4;
          local_840._20_4_ = local_920._20_4_ * fVar3;
          local_840._24_4_ = local_920._24_4_ * fVar2;
          local_840._28_4_ = local_8e0._28_4_;
          auVar45 = vxorps_avx512vl(auVar56,auVar56);
          auVar104 = ZEXT1664(auVar45);
          do {
            local_b00 = auVar105._0_16_;
            local_b10 = auVar106._0_16_;
            auVar45 = auVar104._0_16_;
            local_ac0 = auVar97._0_32_;
            uVar33 = 0;
            for (uVar43 = uVar27; (uVar43 & 1) == 0; uVar43 = uVar43 >> 1 | 0x8000000000000000) {
              uVar33 = uVar33 + 1;
            }
            pGVar16 = (pSVar14->geometries).items[*(uint *)(local_9e0 + uVar33 * 4)].ptr;
            if ((pGVar16->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar16->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_006e60ab:
                *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                return bVar42;
              }
              uVar43 = (ulong)(uint)((int)uVar33 * 4);
              uVar7 = *(undefined4 *)(local_8e0 + uVar43);
              local_a60._4_4_ = uVar7;
              local_a60._0_4_ = uVar7;
              local_a60._8_4_ = uVar7;
              local_a60._12_4_ = uVar7;
              uVar7 = *(undefined4 *)(local_8c0 + uVar43);
              local_a50._4_4_ = uVar7;
              local_a50._0_4_ = uVar7;
              local_a50._8_4_ = uVar7;
              local_a50._12_4_ = uVar7;
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_8a0 + uVar43);
              local_af0.context = context->user;
              local_a30 = vpbroadcastd_avx512vl();
              uVar7 = *(undefined4 *)(local_a00 + uVar43);
              local_a40._4_4_ = uVar7;
              local_a40._0_4_ = uVar7;
              local_a40._8_4_ = uVar7;
              local_a40._12_4_ = uVar7;
              uVar7 = *(undefined4 *)((long)local_880 + uVar43);
              local_a90._4_4_ = uVar7;
              local_a90._0_4_ = uVar7;
              local_a90._8_4_ = uVar7;
              local_a90._12_4_ = uVar7;
              uVar7 = *(undefined4 *)(local_860 + uVar43);
              local_a80._4_4_ = uVar7;
              local_a80._0_4_ = uVar7;
              local_a80._8_4_ = uVar7;
              local_a80._12_4_ = uVar7;
              uVar7 = *(undefined4 *)(local_840 + uVar43);
              local_a70._4_4_ = uVar7;
              local_a70._0_4_ = uVar7;
              local_a70._8_4_ = uVar7;
              local_a70._12_4_ = uVar7;
              vpcmpeqd_avx2(ZEXT1632(local_a30),ZEXT1632(local_a30));
              uStack_a1c = (local_af0.context)->instID[0];
              local_a20 = uStack_a1c;
              uStack_a18 = uStack_a1c;
              uStack_a14 = uStack_a1c;
              uStack_a10 = (local_af0.context)->instPrimID[0];
              uStack_a0c = uStack_a10;
              uStack_a08 = uStack_a10;
              uStack_a04 = uStack_a10;
              local_b40 = local_aa0;
              local_af0.valid = (int *)local_b40;
              local_af0.geometryUserPtr = pGVar16->userPtr;
              local_af0.hit = local_a90;
              local_af0.N = 4;
              local_af0.ray = (RTCRayN *)ray;
              if (pGVar16->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar16->occlusionFilterN)(&local_af0);
                auVar97 = ZEXT3264(local_ac0);
                auVar45 = vxorps_avx512vl(auVar45,auVar45);
                auVar104 = ZEXT1664(auVar45);
                auVar106 = ZEXT1664(local_b10);
                auVar105 = ZEXT1664(local_b00);
              }
              auVar45 = auVar104._0_16_;
              uVar43 = vptestmd_avx512vl(local_b40,local_b40);
              if ((uVar43 & 0xf) != 0) {
                p_Var19 = context->args->filter;
                if ((p_Var19 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar16->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  (*p_Var19)(&local_af0);
                  auVar97 = ZEXT3264(local_ac0);
                  auVar45 = vxorps_avx512vl(auVar45,auVar45);
                  auVar104 = ZEXT1664(auVar45);
                  auVar106 = ZEXT1664(local_b10);
                  auVar105 = ZEXT1664(local_b00);
                }
                uVar43 = vptestmd_avx512vl(local_b40,local_b40);
                uVar43 = uVar43 & 0xf;
                auVar45 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                bVar41 = (bool)((byte)uVar43 & 1);
                auVar46._0_4_ =
                     (uint)bVar41 * auVar45._0_4_ | (uint)!bVar41 * *(int *)(local_af0.ray + 0x80);
                bVar41 = (bool)((byte)(uVar43 >> 1) & 1);
                auVar46._4_4_ =
                     (uint)bVar41 * auVar45._4_4_ | (uint)!bVar41 * *(int *)(local_af0.ray + 0x84);
                bVar41 = (bool)((byte)(uVar43 >> 2) & 1);
                auVar46._8_4_ =
                     (uint)bVar41 * auVar45._8_4_ | (uint)!bVar41 * *(int *)(local_af0.ray + 0x88);
                bVar41 = SUB81(uVar43 >> 3,0);
                auVar46._12_4_ =
                     (uint)bVar41 * auVar45._12_4_ | (uint)!bVar41 * *(int *)(local_af0.ray + 0x8c);
                *(undefined1 (*) [16])(local_af0.ray + 0x80) = auVar46;
                if ((byte)uVar43 != 0) goto LAB_006e60ab;
              }
              *(int *)(ray + k * 4 + 0x80) = auVar97._0_4_;
            }
            uVar27 = uVar27 ^ 1L << (uVar33 & 0x3f);
          } while (uVar27 != 0);
        }
        auVar103 = ZEXT1664(auVar102);
        auVar101 = ZEXT1664(auVar100);
        auVar97 = ZEXT1664(auVar44);
        local_b20 = local_b20 + 1;
      } while (local_b20 != local_b28);
    }
LAB_006e6095:
    bVar42 = puVar37 != &local_800;
    if (!bVar42) {
      return bVar42;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }